

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void crnlib::vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  uint uVar1;
  undefined8 uVar2;
  uint i;
  long lVar3;
  void *pvVar4;
  
  if (num != 0) {
    pvVar4 = (void *)((ulong)num * 0x38 + (long)pSrc_void);
    do {
      lVar3 = 0;
      do {
        *(undefined4 *)((long)pDst_void + lVar3 * 4) = *(undefined4 *)((long)pSrc_void + lVar3 * 4);
        lVar3 = lVar3 + 1;
      } while (lVar3 == 1);
      *(undefined4 *)((long)pDst_void + 0x10) = *(undefined4 *)((long)pSrc_void + 0x10);
      *(undefined8 *)((long)pDst_void + 8) = *(undefined8 *)((long)pSrc_void + 8);
      *(undefined8 *)((long)pDst_void + 0x18) = 0;
      *(undefined8 *)((long)pDst_void + 0x20) = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)((long)pDst_void + 0x18),*(uint *)((long)pSrc_void + 0x20),
                 false,4,(object_mover)0x0,false);
      uVar1 = *(uint *)((long)pSrc_void + 0x20);
      *(uint *)((long)pDst_void + 0x20) = uVar1;
      memcpy(*(void **)((long)pDst_void + 0x18),*(void **)((long)pSrc_void + 0x18),(ulong)uVar1 << 2
            );
      uVar2 = *(undefined8 *)((long)pSrc_void + 0x28);
      *(undefined8 *)((long)pDst_void + 0x2d) = *(undefined8 *)((long)pSrc_void + 0x2d);
      *(undefined8 *)((long)pDst_void + 0x28) = uVar2;
      if (*(void **)((long)pSrc_void + 0x18) != (void *)0x0) {
        crnlib_free(*(void **)((long)pSrc_void + 0x18));
      }
      pSrc_void = (void *)((long)pSrc_void + 0x38);
      pDst_void = (void *)((long)pDst_void + 0x38);
    } while (pSrc_void != pvVar4);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }